

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::RelaxFloatOpsPass::IsFloat32(RelaxFloatOpsPass *this,Instruction *inst)

{
  IRContext *this_00;
  bool bVar1;
  uint32_t uVar2;
  const_iterator cVar3;
  Instruction *this_01;
  Op local_1c;
  
  local_1c = inst->opcode_;
  cVar3 = std::
          _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->target_ops_core_f_opnd_)._M_h,&local_1c);
  if (cVar3.super__Node_iterator_base<spv::Op,_false>._M_cur == (__node_type *)0x0) {
    if (inst->has_type_id_ == false) {
      return false;
    }
    uVar2 = Instruction::GetSingleWordOperand(inst,0);
    if (uVar2 == 0) {
      return false;
    }
  }
  else {
    uVar2 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar2 = (uint)inst->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(inst,uVar2);
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = analysis::DefUseManager::GetDef
                        ((this_00->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,uVar2);
    uVar2 = 0;
    if (this_01->has_type_id_ == true) {
      uVar2 = Instruction::GetSingleWordOperand(this_01,0);
    }
  }
  bVar1 = Pass::IsFloat(&this->super_Pass,uVar2,0x20);
  return bVar1;
}

Assistant:

bool RelaxFloatOpsPass::IsFloat32(Instruction* inst) {
  uint32_t ty_id;
  if (target_ops_core_f_opnd_.count(inst->opcode()) != 0) {
    uint32_t opnd_id = inst->GetSingleWordInOperand(0);
    Instruction* opnd_inst = get_def_use_mgr()->GetDef(opnd_id);
    ty_id = opnd_inst->type_id();
  } else {
    ty_id = inst->type_id();
    if (ty_id == 0) return false;
  }
  return IsFloat(ty_id, 32);
}